

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadRefType(BinaryReader *this,Type *out_value,char *desc)

{
  Result RVar1;
  Enum EVar2;
  uint32_t type;
  Type local_1c;
  
  local_1c.enum_ = Any;
  RVar1 = ReadS32Leb128(this,(uint32_t *)&local_1c,desc);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    out_value->enum_ = (Enum)local_1c;
    if ((8 < (uint)(local_1c.enum_ + ~(Func|I32U))) ||
       (EVar2 = Ok, (0x181U >> (local_1c.enum_ + ~(Func|I32U) & 0x1fU) & 1) == 0)) {
      PrintError(this,"%s must be a reference type",desc);
      EVar2 = Error;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReader::ReadRefType(Type* out_value, const char* desc) {
  uint32_t type = 0;
  CHECK_RESULT(ReadS32Leb128(&type, desc));
  *out_value = static_cast<Type>(type);
  ERROR_UNLESS(out_value->IsRef(), "%s must be a reference type", desc);
  return Result::Ok;
}